

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

void luaE_warnerror(lua_State *L,char *where)

{
  lua_WarnFunction UNRECOVERED_JUMPTABLE;
  char *pcVar1;
  
  if ((*(byte *)((L->top).offset + -8) & 0xf) == 4) {
    pcVar1 = (char *)(*(long *)((L->top).offset + -0x10) + 0x18);
  }
  else {
    pcVar1 = "error object is not a string";
  }
  UNRECOVERED_JUMPTABLE = L->l_G->warnf;
  if (UNRECOVERED_JUMPTABLE != (lua_WarnFunction)0x0) {
    (*UNRECOVERED_JUMPTABLE)(L->l_G->ud_warn,"error in ",1);
  }
  UNRECOVERED_JUMPTABLE = L->l_G->warnf;
  if (UNRECOVERED_JUMPTABLE != (lua_WarnFunction)0x0) {
    (*UNRECOVERED_JUMPTABLE)(L->l_G->ud_warn,where,1);
  }
  UNRECOVERED_JUMPTABLE = L->l_G->warnf;
  if (UNRECOVERED_JUMPTABLE != (lua_WarnFunction)0x0) {
    (*UNRECOVERED_JUMPTABLE)(L->l_G->ud_warn," (",1);
  }
  UNRECOVERED_JUMPTABLE = L->l_G->warnf;
  if (UNRECOVERED_JUMPTABLE != (lua_WarnFunction)0x0) {
    (*UNRECOVERED_JUMPTABLE)(L->l_G->ud_warn,pcVar1,1);
  }
  UNRECOVERED_JUMPTABLE = L->l_G->warnf;
  if (UNRECOVERED_JUMPTABLE != (lua_WarnFunction)0x0) {
    (*UNRECOVERED_JUMPTABLE)(L->l_G->ud_warn,")",0);
    return;
  }
  return;
}

Assistant:

void luaE_warnerror (lua_State *L, const char *where) {
  TValue *errobj = s2v(L->top.p - 1);  /* error object */
  const char *msg = (ttisstring(errobj))
                  ? svalue(errobj)
                  : "error object is not a string";
  /* produce warning "error in %s (%s)" (where, msg) */
  luaE_warning(L, "error in ", 1);
  luaE_warning(L, where, 1);
  luaE_warning(L, " (", 1);
  luaE_warning(L, msg, 1);
  luaE_warning(L, ")", 0);
}